

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

bool __thiscall
QWidgetTextControlPrivate::sendMouseEventToInputContext
          (QWidgetTextControlPrivate *this,QEvent *e,Type eventType,MouseButton button,QPointF *pos,
          KeyboardModifiers modifiers,MouseButtons buttons,QPoint *globalPos)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Action AVar6;
  long in_FS_OFFSET;
  QArrayData *local_50;
  ulong local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)&this->field_0x8;
  bVar3 = isPreediting(this);
  if (bVar3) {
    QTextCursor::block();
    QTextBlock::layout();
    iVar4 = (**(code **)(*plVar2 + 0x78))(plVar2,pos,1);
    iVar5 = QTextCursor::position();
    if (-1 < iVar4 - iVar5) {
      QTextLayout::preeditAreaText();
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,2,0x10);
        }
      }
      if ((uint)(iVar4 - iVar5) <= local_40) {
        if (eventType == MouseButtonRelease) {
          AVar6 = QGuiApplication::inputMethod();
          QInputMethod::invokeAction(AVar6,0);
        }
        (**(code **)(*(long *)e + 0x10))(e,1);
        bVar3 = true;
        goto LAB_004c419d;
      }
    }
  }
  bVar3 = false;
LAB_004c419d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetTextControlPrivate::sendMouseEventToInputContext(
        QEvent *e, QEvent::Type eventType, Qt::MouseButton button, const QPointF &pos,
        Qt::KeyboardModifiers modifiers, Qt::MouseButtons buttons, const QPoint &globalPos)
{
    Q_UNUSED(eventType);
    Q_UNUSED(button);
    Q_UNUSED(pos);
    Q_UNUSED(modifiers);
    Q_UNUSED(buttons);
    Q_UNUSED(globalPos);
#if !defined(QT_NO_IM)
    Q_Q(QWidgetTextControl);

    if (isPreediting()) {
        QTextLayout *layout = cursor.block().layout();
        int cursorPos = q->hitTest(pos, Qt::FuzzyHit) - cursor.position();

        if (cursorPos < 0 || cursorPos > layout->preeditAreaText().size())
            cursorPos = -1;

        if (cursorPos >= 0) {
            if (eventType == QEvent::MouseButtonRelease)
                QGuiApplication::inputMethod()->invokeAction(QInputMethod::Click, cursorPos);

            e->setAccepted(true);
            return true;
        }
    }
#else
    Q_UNUSED(e);
#endif
    return false;
}